

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

void Curl_doh_close(Curl_easy *data)

{
  uchar *puVar1;
  doh_probes *pdVar2;
  long mid;
  Curl_easy *in_RAX;
  long lVar3;
  Curl_easy *probe_data;
  
  pdVar2 = (data->req).doh;
  if ((pdVar2 != (doh_probes *)0x0) && (data->multi != (Curl_multi *)0x0)) {
    probe_data = in_RAX;
    for (lVar3 = 8; lVar3 != 0x478; lVar3 = lVar3 + 0x238) {
      mid = *(long *)(pdVar2->probe[0].req_body + lVar3 + -0x14);
      if (-1 < mid) {
        puVar1 = pdVar2->probe[0].req_body + lVar3 + -0x14;
        puVar1[0] = 0xff;
        puVar1[1] = 0xff;
        puVar1[2] = 0xff;
        puVar1[3] = 0xff;
        puVar1[4] = 0xff;
        puVar1[5] = 0xff;
        puVar1[6] = 0xff;
        puVar1[7] = 0xff;
        if (data->multi == (Curl_multi *)0x0) {
          probe_data = (Curl_easy *)0x0;
        }
        else {
          probe_data = Curl_multi_get_handle(data->multi,mid);
          if (probe_data != (Curl_easy *)0x0) {
            curl_multi_remove_handle(data->multi,probe_data);
            Curl_close(&probe_data);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_doh_close(struct Curl_easy *data)
{
  struct doh_probes *doh = data->req.doh;
  if(doh && data->multi) {
    struct Curl_easy *probe_data;
    curl_off_t mid;
    size_t slot;
    for(slot = 0; slot < DOH_SLOT_COUNT; slot++) {
      mid = doh->probe[slot].easy_mid;
      if(mid < 0)
        continue;
      doh->probe[slot].easy_mid = -1;
      /* should have been called before data is removed from multi handle */
      DEBUGASSERT(data->multi);
      probe_data = data->multi ? Curl_multi_get_handle(data->multi, mid) :
        NULL;
      if(!probe_data) {
        DEBUGF(infof(data, "Curl_doh_close: xfer for mid=%"
                     FMT_OFF_T " not found!",
                     doh->probe[slot].easy_mid));
        continue;
      }
      /* data->multi might already be reset at this time */
      curl_multi_remove_handle(data->multi, probe_data);
      Curl_close(&probe_data);
    }
  }
}